

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

wchar_t assertion_file_time(char *file,wchar_t line,char *pathname,long t,long nsec,char type,
                           wchar_t recent)

{
  int iVar1;
  wchar_t wVar2;
  time_t tVar3;
  char *pathname_00;
  stat *__buf;
  uint uVar4;
  undefined7 in_register_00000089;
  stat st;
  char *file_00;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __buf = &st;
  iVar1 = lstat(pathname,(stat *)__buf);
  wVar2 = (wchar_t)__buf;
  if (iVar1 == 0) {
    uVar4 = (uint)(char)nsec;
    file_00 = (char *)(ulong)uVar4;
    if (uVar4 != 0x6d) {
      if (uVar4 == 0x62) {
        st.st_mtim.tv_sec = 0;
      }
      else {
        st.st_mtim.tv_sec = st.st_atim.tv_sec;
        if (uVar4 != 0x61) {
          assertion_file_time_cold_1();
          wVar2 = assertion_file_time(file_00,wVar2,pathname_00,0,0x61,'\x01',(wchar_t)st.st_dev);
          return wVar2;
        }
      }
    }
    if ((char)nsec == 'b') {
      return L'\x01';
    }
    if ((int)CONCAT71(in_register_00000089,type) == 0) {
      if (st.st_mtim.tv_sec == t) {
        return L'\x01';
      }
      failure_start(file,line,"File %s has %ctime %lld.%09lld, expected %lld.%09lld",pathname,
                    (ulong)uVar4,st.st_mtim.tv_sec,0,t,0);
    }
    else {
      tVar3 = time((time_t *)0x0);
      if (st.st_mtim.tv_sec <= tVar3 + 1 && tVar3 + -10 <= st.st_mtim.tv_sec) {
        return L'\x01';
      }
      failure_start(file,line,"File %s has %ctime %lld, %lld seconds ago\n",pathname,(ulong)uVar4,
                    st.st_mtim.tv_sec,tVar3 - st.st_mtim.tv_sec);
    }
  }
  else {
    failure_start(file,line,"Can\'t stat %s\n",pathname);
  }
  failure_finish(file);
  return L'\0';
}

Assistant:

static int
assertion_file_time(const char *file, int line,
    const char *pathname, long t, long nsec, char type, int recent)
{
	long long filet, filet_nsec;
	int r;

#if defined(_WIN32) && !defined(__CYGWIN__)
#define EPOC_TIME	(116444736000000000ULL)
	FILETIME fxtime, fbirthtime, fatime, fmtime;
	ULARGE_INTEGER wintm;
	HANDLE h;
	fxtime.dwLowDateTime = 0;
	fxtime.dwHighDateTime = 0;

	assertion_count(file, line);
	/* Note: FILE_FLAG_BACKUP_SEMANTICS applies to open
	 * a directory file. If not, CreateFile() will fail when
	 * the pathname is a directory. */
	h = CreateFile(pathname, FILE_READ_ATTRIBUTES, 0, NULL,
	    OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, NULL);
	if (h == INVALID_HANDLE_VALUE) {
		failure_start(file, line, "Can't access %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	r = GetFileTime(h, &fbirthtime, &fatime, &fmtime);
	switch (type) {
	case 'a': fxtime = fatime; break;
	case 'b': fxtime = fbirthtime; break;
	case 'm': fxtime = fmtime; break;
	}
	CloseHandle(h);
	if (r == 0) {
		failure_start(file, line, "Can't GetFileTime %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	wintm.LowPart = fxtime.dwLowDateTime;
	wintm.HighPart = fxtime.dwHighDateTime;
	filet = (wintm.QuadPart - EPOC_TIME) / 10000000;
	filet_nsec = ((wintm.QuadPart - EPOC_TIME) % 10000000) * 100;
	nsec = (nsec / 100) * 100; /* Round the request */
#else
	struct stat st;

	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0) {
		failure_start(file, line, "Can't stat %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	switch (type) {
	case 'a': filet = st.st_atime; break;
	case 'm': filet = st.st_mtime; break;
	case 'b': filet = 0; break;
	default: fprintf(stderr, "INTERNAL: Bad type %c for file time", type);
		exit(1);
	}
#if defined(__FreeBSD__)
	switch (type) {
	case 'a': filet_nsec = st.st_atimespec.tv_nsec; break;
	case 'b': filet = st.st_birthtime;
		filet_nsec = st.st_birthtimespec.tv_nsec; break;
	case 'm': filet_nsec = st.st_mtimespec.tv_nsec; break;
	default: fprintf(stderr, "INTERNAL: Bad type %c for file time", type);
		exit(1);
	}
	/* FreeBSD generally only stores to microsecond res, so round. */
	filet_nsec = (filet_nsec / 1000) * 1000;
	nsec = (nsec / 1000) * 1000;
#else
	filet_nsec = nsec = 0;	/* Generic POSIX only has whole seconds. */
	if (type == 'b') return (1); /* Generic POSIX doesn't have birthtime */
#if defined(__HAIKU__)
	if (type == 'a') return (1); /* Haiku doesn't have atime. */
#endif
#endif
#endif
	if (recent) {
		/* Check that requested time is up-to-date. */
		time_t now = time(NULL);
		if (filet < now - 10 || filet > now + 1) {
			failure_start(file, line,
			    "File %s has %ctime %lld, %lld seconds ago\n",
			    pathname, type, filet, now - filet);
			failure_finish(NULL);
			return (0);
		}
	} else if (filet != t || filet_nsec != nsec) {
		failure_start(file, line,
		    "File %s has %ctime %lld.%09lld, expected %lld.%09lld",
		    pathname, type, filet, filet_nsec, t, nsec);
		failure_finish(NULL);
		return (0);
	}
	return (1);
}